

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall MemoryBufferTest_Ctor_Test::TestBody(MemoryBufferTest_Ctor_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_memory_buffer<char,_123UL,_std::allocator<char>_> buffer;
  allocator<char> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  unsigned_long *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  allocator<char> *expected_expression;
  int line;
  char *in_stack_fffffffffffffee0;
  Type in_stack_fffffffffffffeec;
  AssertHelper *in_stack_fffffffffffffef0;
  AssertionResult local_100 [2];
  size_t local_e0;
  undefined8 local_d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff38;
  AssertHelper *in_stack_ffffffffffffff40;
  allocator<char> local_a9;
  basic_buffer<char> local_a8 [5];
  
  expected_expression = &local_a9;
  std::allocator<char>::allocator();
  fmt::v5::basic_memory_buffer<char,_123UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_123UL,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  std::allocator<char>::~allocator(&local_a9);
  local_d8 = 0;
  local_e0 = fmt::v5::internal::basic_buffer<char>::size(local_a8);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((char *)expected_expression,
             (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  uVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff30);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffec8 =
         (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0x12370e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
               (int)((ulong)expected_expression >> 0x20),
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffed0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff40,(Message *)in_stack_ffffffffffffff38.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    testing::Message::~Message((Message *)0x12375c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1237a8);
  this_00 = (AssertHelper *)fmt::v5::internal::basic_buffer<char>::capacity(local_a8);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)expected_expression,(char *)CONCAT17(uVar1,in_stack_fffffffffffffed0),
             (uint *)in_stack_fffffffffffffec8,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  line = (int)((ulong)expected_expression >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x123843);
    testing::internal::AssertHelper::AssertHelper
              (this_00,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,line,
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffed0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff40,(Message *)in_stack_ffffffffffffff38.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffec0));
    testing::Message::~Message((Message *)0x12388f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1238db);
  fmt::v5::basic_memory_buffer<char,_123UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_123UL,_std::allocator<char>_> *)
             CONCAT17(uVar2,in_stack_fffffffffffffec0));
  return;
}

Assistant:

TEST(MemoryBufferTest, Ctor) {
  basic_memory_buffer<char, 123> buffer;
  EXPECT_EQ(static_cast<size_t>(0), buffer.size());
  EXPECT_EQ(123u, buffer.capacity());
}